

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

bool __thiscall
ON_3dmObjectAttributes::AddDisplayMaterialRef
          (ON_3dmObjectAttributes *this,ON_DisplayMaterialRef display_material)

{
  ON_DisplayMaterialRef OVar1;
  bool bVar2;
  ON_DisplayMaterialRef *pOVar3;
  int i_00;
  int local_20;
  int i;
  bool rc;
  ON_3dmObjectAttributes *this_local;
  
  bVar2 = ::operator==(&display_material.m_display_material_id,&ON_nil_uuid);
  if (bVar2) {
LAB_0044a1f4:
    this_local._7_1_ = false;
  }
  else {
    local_20 = ON_SimpleArray<ON_DisplayMaterialRef>::Count(&this->m_dmref);
    do {
      i_00 = local_20 + -1;
      if (local_20 == 0) {
        ON_SimpleArray<ON_DisplayMaterialRef>::Append(&this->m_dmref,&display_material);
        goto LAB_0044a1f4;
      }
      pOVar3 = ON_SimpleArray<ON_DisplayMaterialRef>::operator[](&this->m_dmref,i_00);
      bVar2 = ::operator==(&pOVar3->m_viewport_id,&display_material.m_viewport_id);
      local_20 = i_00;
    } while (!bVar2);
    pOVar3 = ON_SimpleArray<ON_DisplayMaterialRef>::operator[](&this->m_dmref,i_00);
    OVar1 = display_material;
    (pOVar3->m_viewport_id).Data1 = display_material.m_viewport_id.Data1;
    (pOVar3->m_viewport_id).Data2 = display_material.m_viewport_id.Data2;
    (pOVar3->m_viewport_id).Data3 = display_material.m_viewport_id.Data3;
    display_material.m_viewport_id.Data4 = OVar1.m_viewport_id.Data4;
    *&(pOVar3->m_viewport_id).Data4 = display_material.m_viewport_id.Data4;
    display_material.m_display_material_id._0_8_ = OVar1.m_display_material_id._0_8_;
    (pOVar3->m_display_material_id).Data1 = display_material.m_display_material_id.Data1;
    (pOVar3->m_display_material_id).Data2 = display_material.m_display_material_id.Data2;
    (pOVar3->m_display_material_id).Data3 = display_material.m_display_material_id.Data3;
    display_material.m_display_material_id.Data4 = OVar1.m_display_material_id.Data4;
    *&(pOVar3->m_display_material_id).Data4 = display_material.m_display_material_id.Data4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_3dmObjectAttributes::AddDisplayMaterialRef(
  ON_DisplayMaterialRef display_material
  )
{
  bool rc = false;
  if ( !(display_material.m_display_material_id == ON_nil_uuid) )
  {
    int i = m_dmref.Count();
    while(i--)
    {
      if ( m_dmref[i].m_viewport_id == display_material.m_viewport_id )
      {
         m_dmref[i] = display_material;
         return true;
      }
    }
    m_dmref.Append(display_material);
  }
  return rc;
}